

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O3

void __thiscall
rtosc::ThreadLink::ThreadLink(ThreadLink *this,size_t max_message_length,size_t max_messages)

{
  char *__s;
  char *__s_00;
  internal_ringbuffer_t *piVar1;
  char *pcVar2;
  ulong uVar3;
  
  this->MaxMsg = max_message_length;
  uVar3 = max_messages * max_message_length;
  this->BufferSize = uVar3;
  __s = (char *)operator_new__(max_message_length);
  this->write_buffer = __s;
  __s_00 = (char *)operator_new__(max_message_length);
  this->read_buffer = __s_00;
  piVar1 = (internal_ringbuffer_t *)operator_new(0x28);
  this->ring = piVar1;
  pcVar2 = (char *)operator_new__(uVar3);
  piVar1->buffer = pcVar2;
  piVar1->size = uVar3;
  LOCK();
  (piVar1->read).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (piVar1->read_lookahead).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (piVar1->write).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  memset(__s,0,max_message_length);
  memset(__s_00,0,max_message_length);
  return;
}

Assistant:

ThreadLink::ThreadLink(size_t max_message_length, size_t max_messages)
    :MaxMsg(max_message_length),
    BufferSize(MaxMsg*max_messages),
    write_buffer(new char[MaxMsg]),
    read_buffer(new char[MaxMsg]),
    ring(new ringbuffer_t)
{
    ring->buffer         = new char[BufferSize];
    ring->size           = BufferSize;
    ring->read           = 0;
    ring->read_lookahead = 0;
    ring->write          = 0;
    memset(write_buffer, 0, MaxMsg);
    memset(read_buffer, 0, MaxMsg);
}